

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

void __thiscall amrex::MFIter::MFIter(MFIter *this,FabArrayBase *fabarray_,bool do_tiling_)

{
  int iVar1;
  int *piVar2;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
  *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  IntVect local_c;
  
  std::unique_ptr<amrex::FabArrayBase,std::default_delete<amrex::FabArrayBase>>::
  unique_ptr<std::default_delete<amrex::FabArrayBase>,void>(in_stack_ffffffffffffffa0);
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  piVar2 = (int *)(in_RDI + 0x10);
  if ((in_DL & 1) == 0) {
    IntVect::IntVect(&local_c,0);
    *(undefined8 *)piVar2 = local_c.vect._0_8_;
    piVar2[2] = local_c.vect[2];
    in_stack_ffffffffffffffc0 = local_c.vect[2];
  }
  else {
    *(undefined8 *)piVar2 = FabArrayBase::mfiter_tile_size;
    *(undefined4 *)(in_RDI + 0x18) = DAT_01aa8260;
  }
  *(byte *)(in_RDI + 0x1c) = in_DL & 1;
  iVar1 = Gpu::numGpuStreams();
  *(int *)(in_RDI + 0x2c) = iVar1;
  IndexType::IndexType((IndexType *)(in_RDI + 0x30));
  *(undefined1 *)(in_RDI + 0x34) = 0;
  DeviceSync::DeviceSync((DeviceSync *)(in_RDI + 0x35),true);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  Initialize((MFIter *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

MFIter::MFIter (const FabArrayBase& fabarray_,
                bool                do_tiling_)
    :
    fabArray(fabarray_),
    tile_size((do_tiling_) ? FabArrayBase::mfiter_tile_size : IntVect::TheZeroVector()),
    flags(do_tiling_ ? Tiling : 0),
    streams(Gpu::numGpuStreams()),
    dynamic(false),
    device_sync(true),
    index_map(nullptr),
    local_index_map(nullptr),
    tile_array(nullptr),
    local_tile_index_map(nullptr),
    num_local_tiles(nullptr)
{
    Initialize();
}